

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O0

void file_buff_write(FileBuff buff,void *src,int len)

{
  int in_EDX;
  void *in_RSI;
  int *in_RDI;
  int avail;
  int local_18;
  int local_14;
  
  local_14 = in_EDX;
  while (0 < local_14) {
    local_18 = 0x10000 - *in_RDI;
    if (local_14 < local_18) {
      local_18 = local_14;
    }
    memcpy((void *)((long)in_RDI + (long)*in_RDI + 8),in_RSI,(long)local_18);
    local_14 = local_14 - local_18;
    in_RSI = (void *)((long)in_RSI + (long)local_18);
    *in_RDI = local_18 + *in_RDI;
    if (*in_RDI == 0x10000) {
      unix_write(len,in_RDI,(int)((ulong)in_RSI >> 0x20));
      *in_RDI = 0;
    }
  }
  return;
}

Assistant:

static void
file_buff_write( FileBuff  buff, const void*  src, int  len )
{
    while (len > 0) {
        int  avail = sizeof(buff->data) - buff->count;
        if (avail > len)
            avail = len;

        memcpy( buff->data + buff->count, src, avail );
        len -= avail;
        src  = (char*)src + avail;

        buff->count += avail;
        if (buff->count == FILE_BUFF_SIZE) {
            unix_write( buff->fd, buff->data, buff->count );
            buff->count = 0;
        }
    }
}